

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_doc_free(fdb_doc *doc)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    free(*(void **)((long)in_RDI + 0x20));
    free(*(void **)((long)in_RDI + 0x38));
    free(*(void **)((long)in_RDI + 0x40));
    free(in_RDI);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

LIBFDB_API
fdb_status fdb_doc_free(fdb_doc *doc)
{
    if (doc) {
        free(doc->key);
        free(doc->meta);
        free(doc->body);
        free(doc);
    }
    return FDB_RESULT_SUCCESS;
}